

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O3

void absl::lts_20250127::base_internal::ThrowStdRangeError(char *what_arg)

{
  range_error *this;
  
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,what_arg);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void ThrowStdRangeError(const char* what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::range_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg);
  std::abort();
#endif
}